

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O0

oonf_subsystem * oonf_subsystem_load(char *libname)

{
  undefined8 uVar1;
  avl_node *local_80;
  avl_node *local_78;
  int local_6c;
  void *pvStack_68;
  int idx;
  void *dlhandle;
  oonf_subsystem *plugin;
  char *libname_local;
  undefined4 local_48;
  undefined4 local_44;
  uint8_t *local_40;
  oonf_subsystem *local_38;
  char *local_30;
  undefined8 local_28;
  avl_node *local_20;
  undefined8 local_18;
  avl_node *local_10;
  
  plugin = (oonf_subsystem *)libname;
  local_30 = libname;
  local_20 = avl_find(&oonf_plugin_tree,libname);
  local_28 = 0x70;
  if (local_20 == (avl_node *)0x0) {
    local_78 = (avl_node *)0x0;
  }
  else {
    local_78 = local_20 + -2;
  }
  dlhandle = local_78;
  if (local_78 == (avl_node *)0x0) {
    pvStack_68 = _open_plugin((char *)plugin,&local_6c);
    if (pvStack_68 == (void *)0x0) {
      return (oonf_subsystem *)0x0;
    }
    local_38 = plugin;
    local_10 = avl_find(&oonf_plugin_tree,plugin);
    local_18 = 0x70;
    if (local_10 == (avl_node *)0x0) {
      local_80 = (avl_node *)0x0;
    }
    else {
      local_80 = local_10 + -2;
    }
    dlhandle = local_80;
    if (local_80 == (avl_node *)0x0) {
      local_40 = log_global_mask;
      local_44 = 4;
      local_48 = 4;
      if ((log_global_mask[4] & 4) != 0) {
        uVar1 = dlerror();
        oonf_log(LOG_SEVERITY_WARN,LOG_PLUGINS,"src/libcore/oonf_subsystem.c",0x138,(void *)0x0,0,
                 "dynamic library loading failed: \"%s\"!\n",uVar1);
      }
      dlclose(pvStack_68);
      return (oonf_subsystem *)0x0;
    }
    local_80[1].key = pvStack_68;
    local_80[1].balance = (undefined1)local_6c;
    local_80[1].follower = (_Bool)local_6c._1_1_;
    *(undefined2 *)&local_80[1].field_0x32 = local_6c._2_2_;
  }
  return (oonf_subsystem *)dlhandle;
}

Assistant:

struct oonf_subsystem *
oonf_subsystem_load(const char *libname) {
  struct oonf_subsystem *plugin;
  void *dlhandle;
  int idx;

  /* see if the plugin is there */
  if ((plugin = oonf_subsystem_get(libname)) == NULL) {
    /* attempt to load the plugin */
    dlhandle = _open_plugin(libname, &idx);

    if (dlhandle == NULL) {
      /* Logging output has already been done by _open_plugin() */
      return NULL;
    }

    /* plugin should be in the tree now */
    if ((plugin = oonf_subsystem_get(libname)) == NULL) {
      OONF_WARN(LOG_PLUGINS, "dynamic library loading failed: \"%s\"!\n", dlerror());
      dlclose(dlhandle);
      return NULL;
    }

    plugin->_dlhandle = dlhandle;
    plugin->_dlpath_index = idx;
  }
  return plugin;
}